

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

string * __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
          (string *__return_storage_ptr__,View<int,true,std::allocator<unsigned_long>> *this,
          StringStyle *style)

{
  bool bVar1;
  size_t sVar2;
  reference piVar3;
  ostream *poVar4;
  int *piVar5;
  ostringstream *poVar6;
  reference piVar7;
  uint uVar8;
  size_t j;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t j_1;
  size_t y;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c2;
  const_iterator it;
  ostringstream out;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out,_S_out);
  if (*style == TableStyle) {
    sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&out,"A = ");
      piVar5 = operator()(this,0);
LAB_001c6aa2:
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
      goto LAB_001c6b64;
    }
    sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&c1,sVar2,(allocator_type *)&it);
    View<int,_true,_std::allocator<unsigned_long>_>::begin
              (&it,(View<int,_true,_std::allocator<unsigned_long>_> *)this);
    while (bVar1 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&it), bVar1) {
      std::operator<<((ostream *)&out,"A(");
      Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
      for (uVar9 = 0;
          uVar9 < (ulong)((long)c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
      {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
        std::operator<<(poVar4,',');
      }
      poVar4 = std::operator<<((ostream *)&out,"\b) = ");
      piVar7 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
    }
    this_00 = &it.coordinates_;
LAB_001c6a50:
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    if (*style != MatrixStyle) goto LAB_001c6b76;
    sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&out,"A = ");
      piVar5 = operator()(this,0);
      goto LAB_001c6aa2;
    }
    sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 != 1) {
      sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
      if (sVar2 != 2) {
        sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&c1,sVar2,(allocator_type *)&it);
        sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&c2,sVar2,(allocator_type *)&it);
        View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
        if (*(int *)(this + 0x38) == 0) {
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
          uVar8 = (int)sVar2 + 0xfdU & 0xff;
        }
        else {
          uVar8 = 2;
        }
        View<int,_true,_std::allocator<unsigned_long>_>::begin
                  (&it,(View<int,_true,_std::allocator<unsigned_long>_> *)this);
        while (bVar1 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&it), bVar1) {
          Iterator<int,true,std::allocator<unsigned_long>>::
          coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )c2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
          if (it.index_ == 0) {
LAB_001c6d01:
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
            if (*(int *)(this + 0x38) == 0) {
              std::operator<<((ostream *)&out,"A(");
              for (uVar9 = 0;
                  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)this),
                  uVar9 < sVar2 - 2; uVar9 = uVar9 + 1) {
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
                std::operator<<(poVar4,",");
              }
            }
            else {
              std::operator<<((ostream *)&out,"A(c,r,");
              for (uVar9 = 2;
                  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)this),
                  uVar9 < sVar2; uVar9 = uVar9 + 1) {
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
                std::operator<<(poVar4,",");
              }
            }
            std::operator<<((ostream *)&out,'\b');
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
            if (*(int *)(this + 0x38) == 0) {
              std::operator<<((ostream *)&out,",r,c");
            }
            poVar6 = (ostringstream *)std::operator<<((ostream *)&out,") =");
LAB_001c6dcd:
            std::endl<char,std::char_traits<char>>((ostream *)poVar6);
          }
          else {
            if (*(long *)((long)c2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar8 << 3)) !=
                *(long *)((long)c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar8 << 3))) {
              poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&out);
              std::endl<char,std::char_traits<char>>(poVar4);
              goto LAB_001c6d01;
            }
            poVar6 = (ostringstream *)&out;
            if (c2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1] !=
                c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1]) goto LAB_001c6dcd;
          }
          piVar7 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,*piVar7);
          std::operator<<(poVar4," ");
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&c1,&c2);
          Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&it.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::endl<char,std::char_traits<char>>((ostream *)&out);
        this_00 = &c2;
        goto LAB_001c6a50;
      }
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
      if (*(int *)(this + 0x38) == 0) {
        poVar4 = std::operator<<((ostream *)&out,"A(r,c) =");
        std::endl<char,std::char_traits<char>>(poVar4);
        for (uVar9 = 0;
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)this,0),
            uVar9 < sVar2; uVar9 = uVar9 + 1) {
          for (uVar10 = 0;
              sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)this,1),
              uVar10 < sVar2; uVar10 = uVar10 + 1) {
            piVar3 = operator()(this,uVar9,uVar10);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,*piVar3);
            std::operator<<(poVar4,' ');
          }
          std::endl<char,std::char_traits<char>>((ostream *)&out);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&out,"A(c,r) =");
        std::endl<char,std::char_traits<char>>(poVar4);
        for (uVar9 = 0;
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)this,1),
            uVar9 < sVar2; uVar9 = uVar9 + 1) {
          for (uVar10 = 0;
              sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)this,0),
              uVar10 < sVar2; uVar10 = uVar10 + 1) {
            piVar3 = operator()(this,uVar10,uVar9);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,*piVar3);
            std::operator<<(poVar4,' ');
          }
          std::endl<char,std::char_traits<char>>((ostream *)&out);
        }
      }
      goto LAB_001c6b6c;
    }
    std::operator<<((ostream *)&out,"A = (");
    for (uVar9 = 0; uVar9 < *(ulong *)(this + 0x30); uVar9 = uVar9 + 1) {
      piVar3 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_true,_std::allocator<unsigned_long>_> *)this,uVar9);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,*piVar3);
      std::operator<<(poVar4,", ");
    }
    poVar4 = std::operator<<((ostream *)&out,"\b\b)");
LAB_001c6b64:
    std::endl<char,std::char_traits<char>>(poVar4);
  }
LAB_001c6b6c:
  std::endl<char,std::char_traits<char>>((ostream *)&out);
LAB_001c6b76:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string 
View<T, isConst, A>::asString
(
    const StringStyle& style
) const
{
    testInvariant();
    std::ostringstream out(std::ostringstream::out);
    if(style == MatrixStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else if(dimension() == 1) {
            // vector
            out << "A = (";
            for(std::size_t j=0; j<this->size(); ++j) {
                out << (*this)(j) << ", ";
            }
            out << "\b\b)" << std::endl;
        }
        else if(dimension() == 2) {
            // matrix
            if(coordinateOrder() == FirstMajorOrder) {
                out << "A(r,c) =" << std::endl;
                for(std::size_t y=0; y<this->shape(0); ++y) {
                    for(std::size_t x=0; x<this->shape(1); ++x) {
                        out << (*this)(y, x) << ' ';
                    }
                    out << std::endl;
                }
            }
            else {
                out << "A(c,r) =" << std::endl;
                for(std::size_t y=0; y<this->shape(1); ++y) {
                    for(std::size_t x=0; x<this->shape(0); ++x) {
                        out << (*this)(x, y) << ' ';
                    }
                    out << std::endl;
                }
            }
        }
        else {
            // higher dimensional
            std::vector<std::size_t> c1(dimension());
            std::vector<std::size_t> c2(dimension());
            unsigned short q = 2;
            if(coordinateOrder() == FirstMajorOrder) {
                q = static_cast<unsigned char>(dimension() - 3);
            }
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                it.coordinate(c2.begin());
                if(it.index() == 0 || c2[q] != c1[q]) {
                    if(it.index() != 0) {
                        out << std::endl << std::endl;
                    }
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << "A(";
                        for(std::size_t j=0; j<dimension()-2; ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    else {
                        out << "A(c,r,";
                        for(std::size_t j=2; j<dimension(); ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    out << '\b';
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << ",r,c";
                    }
                    out << ") =" << std::endl;
                }
                else if(c2[1] != c1[1]) {
                    out << std::endl;
                }
                out << *it << " ";
                c1 = c2;
            }
            out << std::endl;
        }
        out << std::endl;
    }
    else if(style == TableStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else {
            // non-scalar
            std::vector<std::size_t> c(dimension());
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                out << "A(";
                it.coordinate(c.begin());
                for(std::size_t j=0; j<c.size(); ++j) {
                    out << c[j] << ',';
                }
                out << "\b) = " << *it << std::endl;
            }
        }
        out << std::endl;
    }
    return out.str();
}